

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Base<google::protobuf::FileDescriptorTables> *pBVar1;
  Base<google::protobuf::SourceCodeInfo> *pBVar2;
  Base<google::protobuf::FileOptions> *pBVar3;
  Base<google::protobuf::ServiceOptions> *pBVar4;
  Base<google::protobuf::MethodOptions> *pBVar5;
  int iVar6;
  DescriptorPool *pDVar7;
  pointer pbVar8;
  size_t sVar9;
  size_t __n;
  ulong uVar10;
  Tables *this_01;
  pointer pcVar11;
  void *pvVar12;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar13;
  DescriptorBuilder *pDVar14;
  FileDescriptorProto *pFVar15;
  bool bVar16;
  int iVar17;
  DescriptorPool *pDVar18;
  FileDescriptor *pFVar19;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar20;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_02;
  Rep *pRVar21;
  Nonnull<const_char_*> pcVar22;
  long lVar23;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *pRVar24;
  undefined8 *puVar25;
  RepeatedPtrFieldBase *this_03;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_04;
  RepeatedPtrFieldBase *pRVar26;
  size_type *psVar27;
  long lVar28;
  string_view key;
  string_view element_name;
  string_view key_00;
  string_view name;
  string_view name_00;
  LogMessageFatal local_70;
  Tables **local_60;
  DescriptorBuilder *local_58;
  FileDescriptorProto *local_50;
  char *local_48;
  long local_40;
  void **local_38;
  
  pDVar7 = this->pool_;
  pDVar18 = DescriptorPool::internal_generated_pool();
  if (pDVar7 != pDVar18) {
    DescriptorPool::internal_generated_pool();
    DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
    pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  }
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  key._M_str = (this->filename_)._M_dataplus._M_p;
  key._M_len = (this->filename_)._M_string_length;
  pFVar19 = DescriptorPool::Tables::FindFile(this->tables_,key);
  if ((pFVar19 == (FileDescriptor *)0x0) ||
     (bVar16 = ExistingFileMatchesProto(pFVar19->edition_,pFVar19,proto), !bVar16)) {
    local_60 = &this->tables_;
    pbVar8 = ((*local_60)->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar28 = (long)((*local_60)->pending_files_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    local_58 = this;
    local_50 = proto;
    if (lVar28 != 0) {
      lVar28 = lVar28 >> 5;
      puVar25 = (undefined8 *)
                ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      sVar9 = puVar25[1];
      psVar27 = &pbVar8->_M_string_length;
      lVar23 = 0;
      do {
        __n = *psVar27;
        if ((__n == sVar9) &&
           ((__n == 0 ||
            (iVar17 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (psVar27 + -1))->_M_dataplus)._M_p,(void *)*puVar25,__n), iVar17 == 0)))
           ) {
          AddRecursiveImportError(local_58,local_50,(int)lVar23);
          return (FileDescriptor *)0x0;
        }
        lVar23 = lVar23 + 1;
        psVar27 = psVar27 + 4;
      } while (lVar28 + (ulong)(lVar28 == 0) != lVar23);
    }
    pFVar15 = local_50;
    pDVar14 = local_58;
    puVar25 = (undefined8 *)
              ((ulong)(local_50->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar10 = puVar25[1];
    if (uVar10 < 0x200) {
      if ((local_58->pool_->lazily_build_dependencies_ == false) &&
         (local_58->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(*local_60)->pending_files_,
                    (value_type *)
                    ((ulong)(local_50->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
        ;
        if (0 < *(int *)((long)&pFVar15->field_0 + 0x10)) {
          this_00 = &(pFVar15->field_0)._impl_.dependency_;
          iVar17 = 0;
          do {
            this_01 = *local_60;
            pVVar20 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,iVar17);
            key_00._M_str = (pVVar20->_M_dataplus)._M_p;
            key_00._M_len = pVVar20->_M_string_length;
            pFVar19 = DescriptorPool::Tables::FindFile(this_01,key_00);
            if (pFVar19 == (FileDescriptor *)0x0) {
              pDVar7 = pDVar14->pool_->underlay_;
              if (pDVar7 != (DescriptorPool *)0x0) {
                pVVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar17);
                name._M_str = (pVVar20->_M_dataplus)._M_p;
                name._M_len = pVVar20->_M_string_length;
                pFVar19 = DescriptorPool::FindFileByName(pDVar7,name);
                if (pFVar19 != (FileDescriptor *)0x0) goto LAB_0039a74c;
              }
              pDVar7 = pDVar14->pool_;
              pVVar20 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                  (&this_00->super_RepeatedPtrFieldBase,iVar17);
              name_00._M_str = (pVVar20->_M_dataplus)._M_p;
              name_00._M_len = pVVar20->_M_string_length;
              DescriptorPool::TryFindFileInFallbackDatabase
                        (pDVar7,name_00,pDVar14->deferred_validation_);
            }
LAB_0039a74c:
            iVar17 = iVar17 + 1;
          } while (iVar17 < *(int *)((long)&pFVar15->field_0 + 0x10));
        }
        pbVar8 = ((*local_60)->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ((*local_60)->pending_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar8 + -1;
        pcVar11 = pbVar8[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar11 != &pbVar8[-1].field_2) {
          operator_delete(pcVar11,pbVar8[-1].field_2._M_allocated_capacity + 1);
        }
      }
      local_70.super_LogMessage._0_8_ = *local_60;
      std::
      vector<google::protobuf::DescriptorPool::Tables::CheckPoint,std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>>
      ::emplace_back<google::protobuf::DescriptorPool::Tables*>
                ((vector<google::protobuf::DescriptorPool::Tables::CheckPoint,std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>>
                  *)&((Tables *)local_70.super_LogMessage._0_8_)->checkpoints_,(Tables **)&local_70)
      ;
      this_02 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 *)operator_new(0xe0);
      iVar17 = 0;
      memset(this_02,0,0xe0);
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::FileDescriptor>(this_02,iVar17);
      if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19b,"!has_allocated()");
LAB_0039acdc:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_70);
      }
      pBVar1 = &(this_02->total_).payload_.super_Base<google::protobuf::FileDescriptorTables>;
      pBVar1->value = pBVar1->value + 1;
      protobuf::(anonymous_namespace)::
      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
      ::PlanArray<std::__cxx11::string>
                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  *)this_02,2);
      aVar13 = pFVar15->field_0;
      local_48 = "!value || _impl_.options_ != nullptr";
      if ((((undefined1  [232])aVar13 & (undefined1  [232])0x8) == (undefined1  [232])0x0) ||
         ((pFVar15->field_0)._impl_.options_ != (FileOptions *)0x0)) {
        if (((undefined1  [232])aVar13 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
          if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
            goto LAB_0039acdc;
          }
          pBVar3 = &(this_02->total_).payload_.super_Base<google::protobuf::FileOptions>;
          pBVar3->value = pBVar3->value + 1;
        }
        if ((((undefined1  [232])aVar13 & (undefined1  [232])0x10) == (undefined1  [232])0x0) ||
           ((pFVar15->field_0)._impl_.source_code_info_ != (SourceCodeInfo *)0x0)) {
          if (((undefined1  [232])aVar13 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
            if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x19b,"!has_allocated()");
              goto LAB_0039acdc;
            }
            pBVar2 = &(this_02->total_).payload_.super_Base<google::protobuf::SourceCodeInfo>;
            pBVar2->value = pBVar2->value + 1;
          }
          if ((this_02->pointers_).payload_.super_Base<char>.value == (PointerT<char>)0x0) {
            lVar28 = *(long *)(((ulong)(pFVar15->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc) + 8);
            (this_02->total_).payload_.super_Base<char>.value =
                 (this_02->total_).payload_.super_Base<char>.value +
                 *(int *)((long)&pFVar15->field_0 + 0x58) * 0x40;
            this_04 = &(pFVar15->field_0)._impl_.service_;
            pRVar24 = this_04;
            if ((*(byte *)((long)&pFVar15->field_0 + 0x50) & 1) != 0) {
              pRVar21 = internal::RepeatedPtrFieldBase::rep(&this_04->super_RepeatedPtrFieldBase);
              pRVar24 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                        pRVar21->elements;
            }
            if (((ulong)(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar21 = internal::RepeatedPtrFieldBase::rep(&this_04->super_RepeatedPtrFieldBase);
              this_04 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                        pRVar21->elements;
            }
            local_38 = &(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                       *(int *)((long)&pFVar15->field_0 + 0x58);
            if (pRVar24 != (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)local_38) {
              local_40 = lVar28 + 1;
              if (lVar28 == 0) {
                local_40 = 0;
              }
              do {
                pvVar12 = (pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
                if (((*(uint *)((long)pvVar12 + 0x10) & 2) != 0) &&
                   (*(long *)((long)pvVar12 + 0x38) == 0)) {
                  iVar17 = 0x3f9e;
                  goto LAB_0039ad8c;
                }
                if ((*(uint *)((long)pvVar12 + 0x10) & 2) != 0) {
                  if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              (&local_70,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                               ,0x19b,"!has_allocated()");
                    goto LAB_0039acdc;
                  }
                  pBVar4 = &(this_02->total_).payload_.super_Base<google::protobuf::ServiceOptions>;
                  pBVar4->value = pBVar4->value + 1;
                }
                iVar17 = (int)*(undefined8 *)
                               ((*(ulong *)((long)pvVar12 + 0x30) & 0xfffffffffffffffc) + 8) +
                         (int)local_40;
                anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::PlanArray<char>(this_02,iVar17 + 5);
                if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            (&local_70,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                             ,0x19b,"!has_allocated()");
                  goto LAB_0039acdc;
                }
                (this_02->total_).payload_.super_Base<char>.value =
                     (this_02->total_).payload_.super_Base<char>.value +
                     *(int *)((long)pvVar12 + 0x20) * 0x50;
                this_03 = (RepeatedPtrFieldBase *)((long)pvVar12 + 0x18);
                pRVar26 = this_03;
                if ((*(byte *)((long)pvVar12 + 0x18) & 1) != 0) {
                  pRVar21 = internal::RepeatedPtrFieldBase::rep(this_03);
                  pRVar26 = (RepeatedPtrFieldBase *)pRVar21->elements;
                }
                if (((ulong)this_03->tagged_rep_or_elem_ & 1) != 0) {
                  pRVar21 = internal::RepeatedPtrFieldBase::rep(this_03);
                  this_03 = (RepeatedPtrFieldBase *)pRVar21->elements;
                }
                iVar6 = *(int *)((long)pvVar12 + 0x20);
                for (; pRVar26 != (RepeatedPtrFieldBase *)(&this_03->tagged_rep_or_elem_ + iVar6);
                    pRVar26 = (RepeatedPtrFieldBase *)&pRVar26->current_size_) {
                  pvVar12 = pRVar26->tagged_rep_or_elem_;
                  anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::PlanArray<char>(this_02,iVar17 + *(int *)((*(ulong *)((long)pvVar12 + 0x18) &
                                                              0xfffffffffffffffc) + 8) + 6);
                  if (((*(uint *)((long)pvVar12 + 0x10) & 8) != 0) &&
                     (*(long *)((long)pvVar12 + 0x30) == 0)) {
                    iVar17 = 0x40d3;
                    goto LAB_0039ad8c;
                  }
                  if ((*(uint *)((long)pvVar12 + 0x10) & 8) != 0) {
                    if ((this_02->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0)
                    {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                (&local_70,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                 ,0x19b,"!has_allocated()");
                      goto LAB_0039acdc;
                    }
                    pBVar5 = &(this_02->total_).payload_.super_Base<google::protobuf::MethodOptions>
                    ;
                    pBVar5->value = pBVar5->value + 1;
                  }
                }
                pRVar24 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                          &(pRVar24->super_RepeatedPtrFieldBase).current_size_;
              } while (pRVar24 !=
                       (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)local_38);
            }
            pFVar15 = local_50;
            PlanAllocationSize(&(local_50->field_0)._impl_.message_type_,
                               *(size_t *)
                                (((ulong)(local_50->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc) + 8),(FlatAllocator *)this_02);
            pDVar14 = local_58;
            PlanAllocationSize(&(pFVar15->field_0)._impl_.enum_type_,
                               *(size_t *)
                                (((ulong)(pFVar15->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc) + 8),(FlatAllocator *)this_02);
            PlanAllocationSize(&(pFVar15->field_0)._impl_.extension_,
                               *(size_t *)
                                (((ulong)(pFVar15->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc) + 8),(FlatAllocator *)this_02);
            iVar17 = internal::SooRep::size
                               (&(pFVar15->field_0)._impl_.weak_dependency_.soo_rep_,
                                (*(byte *)((long)&pFVar15->field_0 + 0x90) & 4) == 0);
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::PlanArray<int>(this_02,iVar17);
            iVar17 = internal::SooRep::size
                               (&(pFVar15->field_0)._impl_.public_dependency_.soo_rep_,
                                (*(byte *)((long)&pFVar15->field_0 + 0x80) & 4) == 0);
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::PlanArray<int>(this_02,iVar17);
            if ((this_02->pointers_).payload_.super_Base<char>.value == (PointerT<char>)0x0) {
              (this_02->total_).payload_.super_Base<char>.value =
                   (this_02->total_).payload_.super_Base<char>.value +
                   *(int *)((long)&pFVar15->field_0 + 0x10) * 8;
              protobuf::(anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)this_02,local_60);
              pFVar19 = BuildFileImpl(pDVar14,pFVar15,(FlatAllocator *)this_02);
              if (pFVar19 == (FileDescriptor *)0x0) {
                DescriptorPool::Tables::RollbackToLastCheckpoint
                          (*local_60,pDVar14->deferred_validation_);
LAB_0039aca0:
                operator_delete(this_02,0xe0);
                return pFVar19;
              }
              DescriptorPool::Tables::ClearLastCheckpoint(*local_60);
              pFVar19->finished_building_ = true;
              iVar17 = (this_02->total_).payload_.super_Base<char>.value;
              iVar6 = (this_02->used_).payload_.super_Base<char>.value;
              if (iVar17 == iVar6) {
                pcVar22 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                    ((long)iVar17,(long)iVar6,
                                     "total_.template Get<U>() == used_.template Get<U>()");
              }
              if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                iVar17 = (this_02->total_).payload_.
                         super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .value;
                iVar6 = (this_02->used_).payload_.
                        super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .value;
                if (iVar17 == iVar6) {
                  pcVar22 = (Nonnull<const_char_*>)0x0;
                }
                else {
                  pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                      ((long)iVar17,(long)iVar6,
                                       "total_.template Get<U>() == used_.template Get<U>()");
                }
                if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                  iVar17 = (this_02->total_).payload_.super_Base<google::protobuf::SourceCodeInfo>.
                           value;
                  iVar6 = (this_02->used_).payload_.super_Base<google::protobuf::SourceCodeInfo>.
                          value;
                  if (iVar17 == iVar6) {
                    pcVar22 = (Nonnull<const_char_*>)0x0;
                  }
                  else {
                    pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                        ((long)iVar17,(long)iVar6,
                                         "total_.template Get<U>() == used_.template Get<U>()");
                  }
                  if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                    iVar17 = (this_02->total_).payload_.
                             super_Base<google::protobuf::FileDescriptorTables>.value;
                    iVar6 = (this_02->used_).payload_.
                            super_Base<google::protobuf::FileDescriptorTables>.value;
                    if (iVar17 == iVar6) {
                      pcVar22 = (Nonnull<const_char_*>)0x0;
                    }
                    else {
                      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                          ((long)iVar17,(long)iVar6,
                                           "total_.template Get<U>() == used_.template Get<U>()");
                    }
                    if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                      iVar17 = (this_02->total_).payload_.super_Base<google::protobuf::FeatureSet>.
                               value;
                      iVar6 = (this_02->used_).payload_.super_Base<google::protobuf::FeatureSet>.
                              value;
                      if (iVar17 == iVar6) {
                        pcVar22 = (Nonnull<const_char_*>)0x0;
                      }
                      else {
                        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                            ((long)iVar17,(long)iVar6,
                                             "total_.template Get<U>() == used_.template Get<U>()");
                      }
                      if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                        iVar17 = (this_02->total_).payload_.
                                 super_Base<google::protobuf::MessageOptions>.value;
                        iVar6 = (this_02->used_).payload_.
                                super_Base<google::protobuf::MessageOptions>.value;
                        if (iVar17 == iVar6) {
                          pcVar22 = (Nonnull<const_char_*>)0x0;
                        }
                        else {
                          pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                              ((long)iVar17,(long)iVar6,
                                               "total_.template Get<U>() == used_.template Get<U>()"
                                              );
                        }
                        if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                          iVar17 = (this_02->total_).payload_.
                                   super_Base<google::protobuf::FieldOptions>.value;
                          iVar6 = (this_02->used_).payload_.
                                  super_Base<google::protobuf::FieldOptions>.value;
                          if (iVar17 == iVar6) {
                            pcVar22 = (Nonnull<const_char_*>)0x0;
                          }
                          else {
                            pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                                ((long)iVar17,(long)iVar6,
                                                 "total_.template Get<U>() == used_.template Get<U>()"
                                                );
                          }
                          if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                            iVar17 = (this_02->total_).payload_.
                                     super_Base<google::protobuf::EnumOptions>.value;
                            iVar6 = (this_02->used_).payload_.
                                    super_Base<google::protobuf::EnumOptions>.value;
                            if (iVar17 == iVar6) {
                              pcVar22 = (Nonnull<const_char_*>)0x0;
                            }
                            else {
                              pcVar22 = absl::lts_20250127::log_internal::
                                        MakeCheckOpString<long,long>
                                                  ((long)iVar17,(long)iVar6,
                                                                                                      
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                            }
                            if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                              iVar17 = (this_02->total_).payload_.
                                       super_Base<google::protobuf::EnumValueOptions>.value;
                              iVar6 = (this_02->used_).payload_.
                                      super_Base<google::protobuf::EnumValueOptions>.value;
                              if (iVar17 == iVar6) {
                                pcVar22 = (Nonnull<const_char_*>)0x0;
                              }
                              else {
                                pcVar22 = absl::lts_20250127::log_internal::
                                          MakeCheckOpString<long,long>
                                                    ((long)iVar17,(long)iVar6,
                                                                                                          
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                              }
                              if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                                iVar17 = (this_02->total_).payload_.
                                         super_Base<google::protobuf::ExtensionRangeOptions>.value;
                                iVar6 = (this_02->used_).payload_.
                                        super_Base<google::protobuf::ExtensionRangeOptions>.value;
                                if (iVar17 == iVar6) {
                                  pcVar22 = (Nonnull<const_char_*>)0x0;
                                }
                                else {
                                  pcVar22 = absl::lts_20250127::log_internal::
                                            MakeCheckOpString<long,long>
                                                      ((long)iVar17,(long)iVar6,
                                                                                                              
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                }
                                if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                                  iVar17 = (this_02->total_).payload_.
                                           super_Base<google::protobuf::OneofOptions>.value;
                                  iVar6 = (this_02->used_).payload_.
                                          super_Base<google::protobuf::OneofOptions>.value;
                                  if (iVar17 == iVar6) {
                                    pcVar22 = (Nonnull<const_char_*>)0x0;
                                  }
                                  else {
                                    pcVar22 = absl::lts_20250127::log_internal::
                                              MakeCheckOpString<long,long>
                                                        ((long)iVar17,(long)iVar6,
                                                                                                                  
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                  }
                                  if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                                    iVar17 = (this_02->total_).payload_.
                                             super_Base<google::protobuf::ServiceOptions>.value;
                                    iVar6 = (this_02->used_).payload_.
                                            super_Base<google::protobuf::ServiceOptions>.value;
                                    if (iVar17 == iVar6) {
                                      pcVar22 = (Nonnull<const_char_*>)0x0;
                                    }
                                    else {
                                      pcVar22 = absl::lts_20250127::log_internal::
                                                MakeCheckOpString<long,long>
                                                          ((long)iVar17,(long)iVar6,
                                                                                                                      
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                    }
                                    if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                                      iVar17 = (this_02->total_).payload_.
                                               super_Base<google::protobuf::MethodOptions>.value;
                                      iVar6 = (this_02->used_).payload_.
                                              super_Base<google::protobuf::MethodOptions>.value;
                                      if (iVar17 == iVar6) {
                                        pcVar22 = (Nonnull<const_char_*>)0x0;
                                      }
                                      else {
                                        pcVar22 = absl::lts_20250127::log_internal::
                                                  MakeCheckOpString<long,long>
                                                            ((long)iVar17,(long)iVar6,
                                                                                                                          
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                      }
                                      if (pcVar22 == (Nonnull<const_char_*>)0x0) {
                                        iVar17 = (this_02->total_).payload_.
                                                 super_Base<google::protobuf::FileOptions>.value;
                                        iVar6 = (this_02->used_).payload_.
                                                super_Base<google::protobuf::FileOptions>.value;
                                        if (iVar17 == iVar6) {
                                          pcVar22 = (Nonnull<const_char_*>)0x0;
                                        }
                                        else {
                                          pcVar22 = absl::lts_20250127::log_internal::
                                                    MakeCheckOpString<long,long>
                                                              ((long)iVar17,(long)iVar6,
                                                                                                                              
                                                  "total_.template Get<U>() == used_.template Get<U>()"
                                                  );
                                        }
                                        if (pcVar22 == (Nonnull<const_char_*>)0x0)
                                        goto LAB_0039aca0;
                                        absl::lts_20250127::log_internal::LogMessageFatal::
                                        LogMessageFatal(&local_70,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar22);
                                      }
                                      else {
                                        absl::lts_20250127::log_internal::LogMessageFatal::
                                        LogMessageFatal(&local_70,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar22);
                                      }
                                    }
                                    else {
                                      absl::lts_20250127::log_internal::LogMessageFatal::
                                      LogMessageFatal(&local_70,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar22);
                                    }
                                  }
                                  else {
                                    absl::lts_20250127::log_internal::LogMessageFatal::
                                    LogMessageFatal(&local_70,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                                  ,0x286,pcVar22);
                                  }
                                }
                                else {
                                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                            (&local_70,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                             ,0x286,pcVar22);
                                }
                              }
                              else {
                                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                          (&local_70,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                           ,0x286,pcVar22);
                              }
                            }
                            else {
                              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                        (&local_70,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                         ,0x286,pcVar22);
                            }
                          }
                          else {
                            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                      (&local_70,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                       ,0x286,pcVar22);
                          }
                        }
                        else {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    (&local_70,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                     ,0x286,pcVar22);
                        }
                      }
                      else {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  (&local_70,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                   ,0x286,pcVar22);
                      }
                    }
                    else {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                (&local_70,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                                 ,0x286,pcVar22);
                    }
                  }
                  else {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              (&local_70,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                               ,0x286,pcVar22);
                  }
                }
                else {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            (&local_70,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                             ,0x286,pcVar22);
                }
              }
              else {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          (&local_70,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                           ,0x286,pcVar22);
              }
            }
            else {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x19b,"!has_allocated()");
            }
          }
          else {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
          }
          goto LAB_0039acdc;
        }
        iVar17 = 0x33e3;
        local_48 = "!value || _impl_.source_code_info_ != nullptr";
      }
      else {
        iVar17 = 0x3381;
      }
LAB_0039ad8c:
      internal::protobuf_assumption_failed
                (local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                 ,iVar17);
    }
    pFVar19 = (FileDescriptor *)0x0;
    element_name._M_str = (char *)*puVar25;
    element_name._M_len = uVar10;
    AddError(local_58,element_name,&local_50->super_Message,NAME,"Package name is too long");
  }
  return pFVar19;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  // Ensure the generated pool has been lazily initialized.  This is most
  // important for protos that use C++-specific features, since that extension
  // is only registered lazily and we always parse options into the generated
  // pool.
  if (pool_ != DescriptorPool::internal_generated_pool()) {
    DescriptorPool::generated_pool();
  }

  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file->edition(), existing_file,
                                 proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO:  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  static const int kMaximumPackageLength = 511;
  if (proto.package().size() > kMaximumPackageLength) {
    AddError(proto.package(), proto, DescriptorPool::ErrorCollector::NAME,
             "Package name is too long");
    return nullptr;
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i),
                                               deferred_validation_);
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  auto alloc = absl::make_unique<internal::FlatAllocator>();
  PlanAllocationSize(proto, *alloc);
  alloc->FinalizePlanning(tables_);
  FileDescriptor* result = BuildFileImpl(proto, *alloc);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    alloc->ExpectConsumed();
  } else {
    tables_->RollbackToLastCheckpoint(deferred_validation_);
  }

  return result;
}